

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

void __thiscall wirehair::Codec::PeelDiagonal(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint64_t *puVar7;
  PeelRefs *pPVar8;
  uint64_t *puVar9;
  PeelRow *pPVar10;
  uint uVar11;
  uint8_t *__dest;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint i;
  long lVar17;
  uint uVar18;
  uint8_t *vz;
  RowMixIterator mix;
  ushort local_46 [3];
  PeelRow *local_40;
  ulong local_38;
  
  uVar1 = this->_peel_head_rows;
  while (uVar1 != 0xffff) {
    puVar7 = this->_compress_matrix;
    local_40 = this->_peel_rows + uVar1;
    uVar2 = (local_40->Marks).Unmarked[0];
    uVar15 = this->_ge_pitch * (uint)uVar1;
    uVar3 = this->_defer_count;
    uVar4 = this->_mix_count;
    uVar5 = this->_mix_next_prime;
    local_46[0] = (local_40->Params).MixFirst;
    uVar12 = (uint)local_46[0];
    uVar6 = (local_40->Params).MixAdd;
    lVar17 = 1;
    do {
      uVar12 = ((uVar12 & 0xffff) + (uint)uVar6) % (uint)uVar5;
      if (uVar4 <= uVar12) {
        uVar12 = uVar5 - uVar12;
        uVar18 = uVar12 & 0xffff;
        if (uVar6 < (ushort)uVar12) {
          uVar12 = ((uint)uVar6 * 0x10000 - uVar18) % (uint)uVar6;
        }
        else {
          uVar12 = uVar6 - uVar18;
        }
      }
      local_46[lVar17] = (ushort)uVar12;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    uVar12 = (uint)local_46[0] + (uint)uVar3;
    puVar7[(ulong)uVar15 + (ulong)(uVar12 >> 6)] =
         puVar7[(ulong)uVar15 + (ulong)(uVar12 >> 6)] ^ 1L << ((ulong)uVar12 & 0x3f);
    uVar12 = (uint)local_46[1] + (uint)uVar3;
    puVar7[(ulong)uVar15 + (ulong)(uVar12 >> 6)] =
         puVar7[(ulong)uVar15 + (ulong)(uVar12 >> 6)] ^ 1L << ((ulong)uVar12 & 0x3f);
    puVar7[(ulong)uVar15 + (ulong)((uint)local_46[2] + (uint)uVar3 >> 6)] =
         puVar7[(ulong)uVar15 + (ulong)((uint)local_46[2] + (uint)uVar3 >> 6)] ^
         1L << ((ulong)((uint)local_46[2] + (uint)uVar3) & 0x3f);
    uVar12 = this->_block_bytes;
    uVar18 = (uint)uVar2;
    __dest = this->_recovery_blocks + uVar12 * uVar18;
    if ((local_40->Marks).Result.IsCopied == '\0') {
      if (this->_block_count - 1 == (uint)uVar1) {
        memcpy(__dest,this->_input_blocks + uVar12 * uVar1,(ulong)this->_input_final_bytes);
        memset(__dest + this->_input_final_bytes,0,
               (ulong)(this->_block_bytes - this->_input_final_bytes));
      }
      else {
        memcpy(__dest,this->_input_blocks + uVar12 * uVar1,(ulong)uVar12);
      }
    }
    pPVar8 = this->_peel_col_refs;
    uVar16 = (ulong)pPVar8->Rows[(ulong)uVar18 + (ulong)uVar2 * 0x20 + -1];
    if (uVar16 != 0) {
      uVar13 = 0;
      local_38 = uVar16;
      do {
        uVar3 = pPVar8->Rows[(ulong)uVar18 + (ulong)uVar2 * 0x20 + uVar13];
        if (uVar3 != uVar1) {
          uVar12 = this->_ge_pitch;
          uVar11 = (uint)uVar3;
          if ((ulong)uVar12 != 0) {
            puVar9 = this->_compress_matrix;
            uVar14 = 0;
            do {
              puVar9[uVar12 * uVar11 + uVar14] =
                   puVar9[uVar12 * uVar11 + uVar14] ^ puVar7[uVar15 + uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar12 != uVar14);
          }
          pPVar10 = this->_peel_rows;
          if (pPVar10[uVar11].Marks.Unmarked[0] != 0xffff) {
            uVar12 = this->_block_bytes;
            vz = this->_recovery_blocks + pPVar10[uVar11].Marks.Unmarked[0] * uVar12;
            if (pPVar10[uVar11].Marks.Result.IsCopied == '\0') {
              if (this->_block_count - 1 == uVar11) {
                gf256_addset_mem(vz,__dest,this->_input_blocks + uVar12 * uVar11,
                                 this->_input_final_bytes);
                uVar12 = this->_input_final_bytes;
                memcpy(vz + uVar12,__dest + uVar12,(ulong)(this->_block_bytes - uVar12));
              }
              else {
                gf256_addset_mem(vz,__dest,this->_input_blocks + uVar12 * uVar11,uVar12);
              }
              pPVar10[uVar11].Marks.Result.IsCopied = '\x01';
              uVar16 = local_38;
            }
            else {
              gf256_add_mem(vz,__dest,uVar12);
              uVar16 = local_38;
            }
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar16);
    }
    uVar1 = local_40->NextRow;
  }
  return;
}

Assistant:

void Codec::PeelDiagonal()
{
    CAT_IF_DUMP(cout << endl << "---- PeelDiagonal ----" << endl << endl;)

    /*
        This function optimizes the block value generation by combining the first
        memcpy and memxor operations together into a three-way memxor if possible,
        using the is_copied row member.
    */

    CAT_IF_ROWOP(unsigned rowops = 0;)

    PeelRow * GF256_RESTRICT row;

    // For each peeled row in forward solution order:
    for (uint16_t peel_row_i = _peel_head_rows;
        peel_row_i != LIST_TERM;
        peel_row_i = row->NextRow)
    {
        row = &_peel_rows[peel_row_i];

        // Lookup peeling results
        const uint16_t peel_column_i = row->Marks.Result.PeelColumn;
        uint64_t *ge_row = _compress_matrix + _ge_pitch * peel_row_i;

        CAT_IF_DUMP(cout << "Peeled row " << peel_row_i << " for peeled column " << peel_column_i << " :";)

        const unsigned defer_count = _defer_count;
        const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

        // Generate mixing column 1
        const unsigned ge_column_i = defer_count + mix.Columns[0];
        ge_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
        CAT_IF_DUMP(cout << " " << ge_column_i;)

        // Generate mixing column 2
        const unsigned ge_column_j = defer_count + mix.Columns[1];
        ge_row[ge_column_j >> 6] ^= (uint64_t)1 << (ge_column_j & 63);
        CAT_IF_DUMP(cout << " " << ge_column_j;)

        // Generate mixing column 3
        const unsigned ge_column_k = defer_count + mix.Columns[2];
        ge_row[ge_column_k >> 6] ^= (uint64_t)1 << (ge_column_k & 63);
        CAT_IF_DUMP(cout << " " << ge_column_k << endl;)

        // Get pointer to output block
        CAT_DEBUG_ASSERT(peel_column_i < _recovery_rows);
        uint8_t * GF256_RESTRICT temp_block_src = _recovery_blocks + _block_bytes * peel_column_i;

        // If row has not been copied yet:
        if (!row->Marks.Result.IsCopied)
        {
            const uint8_t * GF256_RESTRICT block_src = _input_blocks + _block_bytes * peel_row_i;

            // If this is not the last block:
            if (peel_row_i != _block_count - 1) {
                // Copy it directly to the output block
                memcpy(temp_block_src, block_src, _block_bytes);
            }
            else
            {
                // Copy with zero padding
                memcpy(temp_block_src, block_src, _input_final_bytes);
                CAT_DEBUG_ASSERT(_block_bytes >= _input_final_bytes);
                memset(temp_block_src + _input_final_bytes, 0, _block_bytes - _input_final_bytes);
            }
            CAT_IF_ROWOP(++rowops;)

            CAT_IF_DUMP(cout << "-- Copied from " << peel_row_i <<
                " because has not been copied yet.  Output block = " <<
                (unsigned)temp_block_src[0] << endl;)

            // Note that we do not need to set is_copied here because no
            // further rows reference this one
        }

        CAT_IF_DUMP(cout << "++ Adding to referencing rows:";)

        PeelRefs * GF256_RESTRICT refs = &_peel_col_refs[peel_column_i];
        const uint16_t * GF256_RESTRICT referencingRows = refs->Rows;

        // For each row that references this one:
        for (unsigned i = 0, count = refs->RowCount; i < count; ++i)
        {
            const uint16_t ref_row_i = referencingRows[i];

            // If it references the current row:
            if (ref_row_i == peel_row_i) {
                // Skip this row
                continue;
            }

            CAT_IF_DUMP(cout << " " << ref_row_i;)

            uint64_t * GF256_RESTRICT ge_ref_row = _compress_matrix + _ge_pitch * ref_row_i;

            // Add GE row to referencing GE row
            for (unsigned j = 0; j < _ge_pitch; ++j) {
                ge_ref_row[j] ^= ge_row[j];
            }

            PeelRow * GF256_RESTRICT ref_row = &_peel_rows[ref_row_i];
            const uint16_t ref_column_i = ref_row->Marks.Result.PeelColumn;

            // If row is peeled:
            if (ref_column_i != LIST_TERM)
            {
                // Generate temporary row block value:
                CAT_DEBUG_ASSERT(ref_column_i < _recovery_rows);
                uint8_t * GF256_RESTRICT temp_block_dest = _recovery_blocks + _block_bytes * ref_column_i;

                // If referencing row is already copied to the recovery blocks:
                if (ref_row->Marks.Result.IsCopied) {
                    // Add this row block value to it
                    gf256_add_mem(temp_block_dest, temp_block_src, _block_bytes);
                }
                else
                {
                    const uint8_t * GF256_RESTRICT block_src = _input_blocks + _block_bytes * ref_row_i;

                    // If this is not the last block:
                    if (ref_row_i != _block_count - 1) {
                        // Add this row block value with message block to it (optimization)
                        gf256_addset_mem(temp_block_dest, temp_block_src, block_src, _block_bytes);
                    }
                    else
                    {
                        // Add with zero padding
                        gf256_addset_mem(temp_block_dest, temp_block_src, block_src, _input_final_bytes);

                        CAT_DEBUG_ASSERT(_block_bytes >= _input_final_bytes);
                        memcpy(
                            temp_block_dest + _input_final_bytes,
                            temp_block_src + _input_final_bytes,
                            _block_bytes - _input_final_bytes);
                    }

                    ref_row->Marks.Result.IsCopied = 1;
                }

                CAT_IF_ROWOP(++rowops;)
            } // end if referencing row is peeled

        } // next referencing row

        CAT_IF_DUMP(cout << endl;)

    } // next peeled row

    CAT_IF_ROWOP(cout << "PeelDiagonal used " << rowops << " row ops = "
        << rowops / (double)_block_count << "*N" << endl;)
}